

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFilter.hpp
# Opt level: O2

void __thiscall binlog::EventFilter::EventFilter(EventFilter *this,Predicate *isAllowed)

{
  _Rb_tree_header *p_Var1;
  
  std::function<bool_(const_binlog::EventSource_&)>::function(&this->_isAllowed,isAllowed);
  p_Var1 = &(this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header;
  (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

inline EventFilter::EventFilter(Predicate isAllowed)
  :_isAllowed(std::move(isAllowed))
{}